

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvafakebios.c
# Opt level: O0

void chksum(uint8_t *data,uint length)

{
  uint8_t sum;
  uint16_t i;
  uint length_local;
  uint8_t *data_local;
  
  sum = '\0';
  data[length - 1] = '\0';
  for (i = 0; i < length; i = i + 1) {
    sum = sum + data[i];
  }
  if (sum != '\0') {
    sum = -sum;
  }
  data[length - 1] = sum;
  return;
}

Assistant:

static void chksum(uint8_t *data, unsigned int length)
{
	uint16_t i;
	uint8_t sum = 0;

	data[length-1] = 0;
	for (i = 0; i < length; i++)
		sum += data[i];

	if (sum)
		sum = 256 - sum;

	data[length-1] = sum;
}